

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O0

bool wallet::walletload_tests::HasAnyRecordOfType(WalletDatabase *db,string *key)

{
  bool bVar1;
  __type_conflict _Var2;
  int iVar3;
  pointer pDVar4;
  pointer pDVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  Status status;
  DataStream ssValue;
  DataStream ssKey;
  unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> cursor;
  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> batch;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  const_string *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_t in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  const_string *in_stack_fffffffffffffe30;
  undefined8 *puVar6;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  uint local_194;
  byte local_169;
  undefined8 local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_160;
  undefined8 local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  const_string local_128 [2];
  lazy_ostream local_108;
  undefined1 local_b0 [8];
  const_string local_a8 [2];
  lazy_ostream local_88;
  assertion_result local_68 [2];
  undefined1 local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*in_RDI + 0x70))(local_30,in_RDI,0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    boost::test_tools::assertion_result::
    assertion_result<std::unique_ptr<wallet::DatabaseBatch,std::default_delete<wallet::DatabaseBatch>>>
              ((assertion_result *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> *)
               in_stack_fffffffffffffe00);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe00,
               (basic_cstring<const_char> *)in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffdf8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_68,&local_88,local_a8,0x59,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffdf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffdf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  pDVar4 = std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::
           operator->((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                       *)in_stack_fffffffffffffdf8);
  (*pDVar4->_vptr_DatabaseBatch[9])(local_b0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    boost::test_tools::assertion_result::
    assertion_result<std::unique_ptr<wallet::DatabaseCursor,std::default_delete<wallet::DatabaseCursor>>>
              ((assertion_result *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> *)
               in_stack_fffffffffffffe00);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe00,
               (basic_cstring<const_char> *)in_stack_fffffffffffffdf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (pointer)in_stack_fffffffffffffe00,(unsigned_long)in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffdf8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xffffffffffffff18,&local_108,local_128,0x5b,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffdf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffdf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffffe3c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe3c);
  } while (bVar1);
  while( true ) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_148.field_2._M_allocated_capacity = 0;
    local_148.field_2._8_8_ = 0;
    local_148._M_dataplus._M_p = (pointer)0x0;
    local_148._M_string_length = 0;
    __lhs = &local_148;
    DataStream::DataStream((DataStream *)in_stack_fffffffffffffdf8);
    local_158 = 0;
    local_168 = 0;
    puVar6 = &local_168;
    pbStack_160 = __rhs;
    pbStack_150 = __rhs;
    DataStream::DataStream((DataStream *)in_stack_fffffffffffffdf8);
    pDVar5 = std::unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>::
             operator->((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>
                         *)in_stack_fffffffffffffdf8);
    iVar3 = (*pDVar5->_vptr_DatabaseCursor[2])(pDVar5,__lhs,puVar6);
    if (iVar3 == 0) {
      __assert_fail("status != DatabaseCursor::Status::FAIL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/walletload_tests.cpp"
                    ,0x60,
                    "bool wallet::walletload_tests::HasAnyRecordOfType(WalletDatabase &, const std::string &)"
                   );
    }
    if (iVar3 == 2) {
      local_194 = 7;
    }
    else {
      std::__cxx11::string::string(&local_28);
      DataStream::operator>>
                ((DataStream *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 in_stack_fffffffffffffe00);
      _Var2 = std::operator==(__lhs,__rhs);
      if (_Var2) {
        local_169 = 1;
      }
      local_194 = (uint)_Var2;
      std::__cxx11::string::~string(in_stack_fffffffffffffdf8);
    }
    DataStream::~DataStream((DataStream *)in_stack_fffffffffffffdf8);
    DataStream::~DataStream((DataStream *)in_stack_fffffffffffffdf8);
    if (local_194 != 0) break;
    in_stack_fffffffffffffe0c = 0;
  }
  if (local_194 == 7) {
    local_169 = 0;
  }
  std::unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>::~unique_ptr
            ((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> *)
             CONCAT44(local_194,in_stack_fffffffffffffe08));
  std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::~unique_ptr
            ((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> *)
             CONCAT44(local_194,in_stack_fffffffffffffe08));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_169 & 1);
}

Assistant:

bool HasAnyRecordOfType(WalletDatabase& db, const std::string& key)
{
    std::unique_ptr<DatabaseBatch> batch = db.MakeBatch(false);
    BOOST_CHECK(batch);
    std::unique_ptr<DatabaseCursor> cursor = batch->GetNewCursor();
    BOOST_CHECK(cursor);
    while (true) {
        DataStream ssKey{};
        DataStream ssValue{};
        DatabaseCursor::Status status = cursor->Next(ssKey, ssValue);
        assert(status != DatabaseCursor::Status::FAIL);
        if (status == DatabaseCursor::Status::DONE) break;
        std::string type;
        ssKey >> type;
        if (type == key) return true;
    }
    return false;
}